

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall
SourceMapTest_Fibonacci_Test::SourceMapTest_Fibonacci_Test(SourceMapTest_Fibonacci_Test *this)

{
  PrintTest::PrintTest((PrintTest *)this);
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0fc0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Module::Module(&(this->super_SourceMapTest).wasm);
  (this->super_SourceMapTest).reader._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = (SourceMapReader *)0x0;
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0ed8;
  return;
}

Assistant:

TEST_F(SourceMapTest, Fibonacci) {
  // Test mapping parsing and debug locs
  std::string sourceMap = R"(
    {
      "version":3,
      "sources":["fib.c"],
      "names":[],
      "mappings": "moBAEA,4BAKA,QAJA,OADA,OAAA,uCAKA"
    }
  )";
  parseMap(sourceMap);

  // Location before the first record has no value
  auto loc = reader->readDebugLocationAt(642);
  EXPECT_FALSE(loc.has_value());

  // TODO: These column numbers show as 0 but emsymbolizer.py prints them as 1.
  // Figure out which is right.
  // First location
  ExpectDbgLocEq(643, 0, 3, 0, std::nullopt);
  // locations in between records have the same value as the previous one.
  for (size_t l = 644; l < 671; l++) {
    ExpectDbgLocEq(l, 0, 3, 0, std::nullopt);
  }
  // Subsequent ones are on record boundaries
  ExpectDbgLocEq(671, 0, 8, 0, std::nullopt);
  ExpectDbgLocEq(679, 0, 4, 0, std::nullopt);
  ExpectDbgLocEq(686, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(693, 0, 3, 0, std::nullopt);
  ExpectDbgLocEq(732, 0, 8, 0, std::nullopt);
  // Entries after the last record have the same value as the last one.
  ExpectDbgLocEq(733, 0, 8, 0, std::nullopt);
  // Should we return empty values for locations that are past the end of the
  // program?
  ExpectDbgLocEq(9999, 0, 8, 0, std::nullopt);
}